

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O0

double ising::square::transfer_matrix::free_energy
                 (double beta,int Lx,int Ly,vector<double,_std::allocator<double>_> *inter,
                 vector<double,_std::allocator<double>_> *field)

{
  size_type sVar1;
  exp_number<double> *this;
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar4;
  int x_1;
  int x;
  int y;
  int j;
  exp_double weight;
  int i;
  exp_double sum;
  vector<double,_std::allocator<double>_> v;
  int dim;
  vector<double,_std::allocator<double>_> field_x;
  vector<double,_std::allocator<double>_> inter_y;
  vector<double,_std::allocator<double>_> inter_x;
  self_ *in_stack_fffffffffffffe88;
  exp_number<double> *in_stack_fffffffffffffe90;
  value_type in_stack_fffffffffffffe98;
  exp_number<double> *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  value_type vVar5;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  exp_number<double> *rhs;
  int local_12c;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  undefined4 in_stack_ffffffffffffff38;
  int iVar6;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  undefined1 local_a9 [25];
  int local_90;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_68 [2];
  vector<double,_std::allocator<double>_> local_38;
  
  std::allocator<double>::allocator((allocator<double> *)0x102aed);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (allocator_type *)in_stack_fffffffffffffea0);
  std::allocator<double>::~allocator((allocator<double> *)0x102b13);
  std::allocator<double>::allocator((allocator<double> *)0x102b32);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (allocator_type *)in_stack_fffffffffffffea0);
  std::allocator<double>::~allocator((allocator<double> *)0x102b58);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
  local_12c = in_EDI;
  if (sVar1 == 0) {
    local_12c = 0;
  }
  this = (exp_number<double> *)(long)local_12c;
  std::allocator<double>::allocator((allocator<double> *)0x102b9d);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (allocator_type *)in_stack_fffffffffffffea0);
  std::allocator<double>::~allocator((allocator<double> *)0x102bc3);
  local_90 = 1 << ((byte)in_EDI & 0x1f);
  this_00 = (vector<double,_std::allocator<double>_> *)(long)local_90;
  rhs = (exp_number<double> *)local_a9;
  std::allocator<double>::allocator((allocator<double> *)0x102bf7);
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,in_stack_fffffffffffffea8,(allocator_type *)in_stack_fffffffffffffea0);
  std::allocator<double>::~allocator((allocator<double> *)0x102c1d);
  standards::exp_number<double>::exp_number
            (in_stack_fffffffffffffe90,(value_type)in_stack_fffffffffffffe88);
  for (iVar6 = 0; iVar6 < local_90; iVar6 = iVar6 + 1) {
    standards::exp_number<double>::exp_number
              (in_stack_fffffffffffffe90,(value_type)in_stack_fffffffffffffe88);
    for (local_dc = 0; local_dc < local_90; local_dc = local_dc + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_a9 + 1),(long)local_dc);
      *pvVar2 = 0.0;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_a9 + 1),(long)iVar6);
    *pvVar2 = 1.0;
    for (local_e0 = 0; local_e0 < in_ESI; local_e0 = local_e0 + 1) {
      for (local_e4 = 0; local_e4 < in_EDI; local_e4 = local_e4 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDX,(long)((in_EDI * local_e0 + local_e4) * 2));
        in_stack_fffffffffffffea0 = (exp_number<double> *)*pvVar3;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_e4);
        *pvVar2 = (value_type)in_stack_fffffffffffffea0;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDX,(long)((in_EDI * local_e0 + local_e4) * 2 + 1));
        vVar5 = *pvVar3;
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_68,(long)local_e4);
        *pvVar2 = vVar5;
      }
      sVar1 = std::vector<double,_std::allocator<double>_>::size(&local_88);
      if (sVar1 != 0) {
        for (local_e8 = 0; local_e8 < in_EDI; local_e8 = local_e8 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RCX,(long)(in_EDI * local_e0 + local_e8));
          in_stack_fffffffffffffe98 = *pvVar3;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_88,(long)local_e8);
          *pvVar2 = in_stack_fffffffffffffe98;
        }
      }
      product_D<std::vector<double,std::allocator<double>>>
                (in_XMM0_Qa,(vector<double,_std::allocator<double>_> *)CONCAT44(in_EDI,in_ESI),
                 in_RDX,in_RCX);
      standards::exp_number<double>::operator*=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
      ;
      product_U<std::vector<double,std::allocator<double>>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(iVar6,in_stack_ffffffffffffff38));
      standards::exp_number<double>::operator*=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
      ;
    }
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(local_a9 + 1),(long)iVar6);
    standards::exp_number<double>::operator*=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    standards::exp_number<double>::operator+=(this,rhs);
  }
  dVar4 = standards::log<double>((exp_number<double> *)0x103019);
  in_XMM0_Qa = -dVar4 / in_XMM0_Qa;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0);
  return in_XMM0_Qa;
}

Assistant:

static double free_energy(double beta, int Lx, int Ly,
                            std::vector<double> const& inter,
                            std::vector<double> const& field = std::vector<double>(0)) {
    std::vector<double> inter_x(Lx), inter_y(Lx), field_x(field.size() > 0 ? Lx : 0);
    int dim = 1 << Lx;
    std::vector<double> v(dim);
    exp_double sum = 0;
    for (int i = 0; i < dim; ++i) {
      exp_double weight = 1;
      for (int j = 0; j < dim; ++j) v[j] = 0;
      v[i] = 1;
      for (int y = 0; y < Ly; ++y) {
        for (int x = 0; x < Lx; ++x) {
          inter_x[x] = inter[2 * (Lx * y + x)];
          inter_y[x] = inter[2 * (Lx * y + x) + 1];
        }
        if (field_x.size()) {
          for (int x = 0; x < Lx; ++x) {
            field_x[x] = field[Lx * y + x];
          }
        }
        weight *= ising::square::transfer_matrix::product_D(beta, inter_x, field_x, v);
        weight *= ising::square::transfer_matrix::product_U(beta, inter_y, v);
      }
      weight *= v[i];
      sum += weight;
    }
    return -log(sum) / beta;
  }